

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_module.cpp
# Opt level: O1

unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_> __thiscall
spvtools::BuildModule
          (spvtools *this,spv_target_env env,MessageConsumer *consumer,uint32_t *binary,size_t size)

{
  _Manager_type p_Var1;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  
  local_48 = (_Manager_type)0x0;
  p_Stack_40 = (_Invoker_type)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  p_Var1 = (consumer->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_58,(_Any_data *)consumer,__clone_functor);
    p_Stack_40 = consumer->_M_invoker;
    local_48 = (consumer->super__Function_base)._M_manager;
  }
  BuildModule(this,env,(MessageConsumer *)&local_58,binary,size,true);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return (__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<opt::IRContext> BuildModule(spv_target_env env,
                                            MessageConsumer consumer,
                                            const uint32_t* binary,
                                            const size_t size) {
  return BuildModule(env, consumer, binary, size, true);
}